

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo-types.cpp
# Opt level: O0

void __thiscall
yactfr::internal::PseudoDlArrayType::PseudoDlArrayType
          (PseudoDlArrayType *this,uint minAlign,PseudoDataLoc *pseudoLenLoc,Up *pseudoElemType,
          Up *attrs,TextLocation loc)

{
  PseudoDataLoc local_98;
  Index local_58;
  Index local_50;
  Index local_48;
  unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> local_40;
  unique_ptr<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_> local_38;
  Up *local_30;
  Up *attrs_local;
  Up *pseudoElemType_local;
  PseudoDataLoc *pseudoLenLoc_local;
  PseudoDlArrayType *pPStack_10;
  uint minAlign_local;
  PseudoDlArrayType *this_local;
  
  local_30 = attrs;
  attrs_local = (Up *)pseudoElemType;
  pseudoElemType_local = (Up *)pseudoLenLoc;
  pseudoLenLoc_local._4_4_ = minAlign;
  pPStack_10 = this;
  std::unique_ptr<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>::
  unique_ptr(&local_38,pseudoElemType);
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::unique_ptr
            (&local_40,attrs);
  local_58 = loc._offset;
  local_50 = loc._lineNumber;
  local_48 = loc._colNumber;
  PseudoArrayType::PseudoArrayType(&this->super_PseudoArrayType,minAlign,&local_38,&local_40,loc);
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            (&local_40);
  std::unique_ptr<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>::
  ~unique_ptr(&local_38);
  PseudoDataLoc::PseudoDataLoc(&local_98,pseudoLenLoc);
  PseudoDlDtMixin::PseudoDlDtMixin(&this->super_PseudoDlDtMixin,&local_98);
  PseudoDataLoc::~PseudoDataLoc(&local_98);
  (this->super_PseudoArrayType).super_PseudoDt._vptr_PseudoDt =
       (_func_int **)&PTR__PseudoDlArrayType_007e1140;
  return;
}

Assistant:

PseudoDlArrayType::PseudoDlArrayType(const unsigned int minAlign, PseudoDataLoc pseudoLenLoc, PseudoDt::Up pseudoElemType,
                                     MapItem::Up attrs, TextLocation loc) :
    PseudoArrayType {minAlign, std::move(pseudoElemType), std::move(attrs), std::move(loc)},
    PseudoDlDtMixin {std::move(pseudoLenLoc)}
{
}